

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O0

int calCoverage(WeightedDomainEnsemble *dEnsemble,MatrixProperties *matProp)

{
  ulong uVar1;
  ulong uVar2;
  type_conflict3 tVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  reference pDVar7;
  long in_RSI;
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  *in_RDI;
  Domain d_1;
  iterator __end1_1;
  iterator __begin1_1;
  DomainSet *__range1_1;
  int curSum;
  int coverage;
  size_t curEnd;
  size_t curStart;
  Domain d;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  value_type *dSet;
  reference dSetIdx;
  integer_iterator<unsigned_long> __end1;
  integer_iterator<unsigned_long> __begin1;
  integer_range<unsigned_long> *__range1;
  int res;
  DomainSet allDomainSet;
  value_type *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
  *in_stack_fffffffffffffea8;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> __last;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
  in_stack_fffffffffffffeb0;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> local_f8;
  Domain *local_f0;
  int local_e8;
  int local_e4;
  ulong local_e0;
  ulong local_d8;
  Domain *local_d0;
  Domain *local_c8;
  Domain local_c0;
  size_t local_a8;
  size_t sStack_a0;
  undefined8 local_98;
  Domain *local_90;
  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> local_88;
  reference local_80;
  reference local_78;
  Domain *local_70;
  value_type local_68;
  value_type local_60;
  iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
  local_48;
  iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
  *local_38;
  int local_2c;
  Domain local_28;
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  *local_8;
  
  local_8 = in_RDI;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)0x1e0dd9);
  local_2c = *(int *)(in_RSI + 0x30);
  std::
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ::size(local_8);
  local_48 = (iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
              )boost::irange<unsigned_long>
                         (CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          (unsigned_long)in_stack_fffffffffffffe98);
  local_38 = &local_48;
  local_60 = (value_type)
             boost::iterator_range_detail::
             iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_38);
  local_68 = (value_type)
             boost::iterator_range_detail::
             iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_38);
  while( true ) {
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8);
    if (!tVar3) break;
    in_stack_fffffffffffffeb0._M_current =
         (Domain *)
         boost::iterators::detail::
         iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
         ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                      *)0x1e0eae);
    local_70 = in_stack_fffffffffffffeb0._M_current;
    local_80 = std::
               vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
               ::operator[](local_8,(size_type)in_stack_fffffffffffffeb0._M_current);
    local_78 = local_80;
    local_88._M_current =
         (Domain *)
         std::vector<Domain,_std::allocator<Domain>_>::begin
                   ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
    local_90 = (Domain *)
               std::vector<Domain,_std::allocator<Domain>_>::end
                         ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                          *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar4) break;
      pDVar7 = __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
               ::operator*(&local_88);
      local_98 = *(undefined8 *)&pDVar7->weight;
      local_a8 = pDVar7->start;
      sStack_a0 = pDVar7->end;
      Domain::Domain(&local_c0,(local_a8 + 1) * (long)local_2c,(sStack_a0 + 1) * (long)local_2c);
      std::vector<Domain,_std::allocator<Domain>_>::push_back
                ((vector<Domain,_std::allocator<Domain>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
      operator++(&local_88);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  __last._M_current = &local_28;
  local_c8 = (Domain *)
             std::vector<Domain,_std::allocator<Domain>_>::begin
                       ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
  local_d0 = (Domain *)
             std::vector<Domain,_std::allocator<Domain>_>::end
                       ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
  std::sort<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>>
            (in_stack_fffffffffffffeb0,__last);
  pvVar6 = std::vector<Domain,_std::allocator<Domain>_>::operator[]
                     ((vector<Domain,_std::allocator<Domain>_> *)&local_28,0);
  local_d8 = pvVar6->start;
  pvVar6 = std::vector<Domain,_std::allocator<Domain>_>::operator[]
                     ((vector<Domain,_std::allocator<Domain>_> *)&local_28,0);
  local_e0 = pvVar6->end;
  local_e4 = (int)local_e0 - (int)local_d8;
  local_e8 = 0;
  local_f0 = &local_28;
  local_f8._M_current =
       (Domain *)
       std::vector<Domain,_std::allocator<Domain>_>::begin
                 ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
  std::vector<Domain,_std::allocator<Domain>_>::end
            ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> *
                       )CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> *
                       )in_stack_fffffffffffffe98);
    if (!bVar4) break;
    pDVar7 = __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
             operator*(&local_f8);
    uVar1 = pDVar7->start;
    uVar2 = pDVar7->end;
    iVar5 = (int)uVar2;
    if (((local_d8 < uVar1) && (local_e0 < uVar2)) && (uVar1 < local_e0)) {
      local_e8 = iVar5 - (int)local_d8;
      local_e0 = uVar2;
    }
    else if ((uVar1 == local_d8) && (local_e0 < uVar2)) {
      local_e8 = iVar5 - (int)local_d8;
      local_e0 = uVar2;
    }
    else if ((local_e0 < uVar1) && (local_e0 < uVar2)) {
      local_e4 = local_e8 + local_e4;
      local_e8 = iVar5 - (int)uVar1;
      local_e0 = uVar2;
      local_d8 = uVar1;
    }
    __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
    operator++(&local_f8);
  }
  iVar5 = local_e8 + local_e4;
  local_e4 = iVar5;
  std::vector<Domain,_std::allocator<Domain>_>::~vector
            ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffffeb0._M_current);
  return iVar5;
}

Assistant:

int calCoverage(WeightedDomainEnsemble& dEnsemble, MatrixProperties matProp) {
    DomainSet allDomainSet; //across all gamma values
    int res = matProp.resolution;

    for (auto dSetIdx : boost::irange(size_t{0}, dEnsemble.domainSets.size())) {
        auto& dSet = dEnsemble.domainSets[dSetIdx];
        for (auto d : dSet)
            allDomainSet.push_back(Domain((d.start+1)*res, (d.end+1)*res));
    }

    sort(allDomainSet.begin(), allDomainSet.end());

    //calculate coverage
    size_t curStart = allDomainSet[0].start;
    size_t curEnd = allDomainSet[0].end;
    int coverage = curEnd - curStart;
    int curSum = 0;
    for (auto d : allDomainSet) {
        if ((d.start>curStart) && (d.end>curEnd) && (d.start<curEnd)) {
            curEnd = d.end;
            curSum = curEnd-curStart;
        } else if ((d.start==curStart) && (d.end>curEnd)) {
            curEnd = d.end;
            curSum = curEnd-curStart;
        } else if ((d.start>curEnd) && (d.end>curEnd)) {
            coverage += curSum;
            curStart = d.start;
            curEnd = d.end;
            curSum = curEnd - curStart;
        }
    }
    coverage += curSum;

    return coverage;
}